

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::EndObject(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            *this,SizeType memberCount)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  uint in_ESI;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDI;
  Member *members;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *members_00;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar1;
  
  allocator = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
              internal::Stack<rapidjson::CrtAllocator>::
              Pop<rapidjson::GenericMember<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&in_RDI->stack_,(ulong)in_ESI);
  internal::Stack<rapidjson::CrtAllocator>::
  Top<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
            (&in_RDI->stack_);
  members_00 = allocator;
  uVar1 = in_ESI;
  GetAllocator(in_RDI);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  SetObjectRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)CONCAT44(uVar1,in_stack_fffffffffffffff0),(Member *)members_00,in_ESI,allocator);
  return true;
}

Assistant:

bool EndObject(SizeType memberCount) {
        typename ValueType::Member* members = stack_.template Pop<typename ValueType::Member>(memberCount);
        stack_.template Top<ValueType>()->SetObjectRaw(members, memberCount, GetAllocator());
        return true;
    }